

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.cpp
# Opt level: O2

NodeRef __thiscall slang::IntervalMapDetails::Path::getRightSibling(Path *this,uint32_t level)

{
  pointer pEVar1;
  int iVar2;
  uint32_t uVar3;
  NodeRef NVar4;
  ulong *puVar5;
  int iVar6;
  ulong uVar7;
  uint32_t uVar8;
  int iVar9;
  bool bVar10;
  
  pEVar1 = (this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  iVar9 = -1;
  iVar2 = 0;
  do {
    iVar6 = iVar2;
    if (level - 1 == iVar6) {
      uVar3 = pEVar1->offset;
      uVar8 = pEVar1->size - 1;
      uVar7 = 0;
      goto LAB_003f9688;
    }
    uVar3 = pEVar1[level + iVar9].offset;
    uVar8 = pEVar1[level + iVar9].size - 1;
    iVar9 = iVar9 + -1;
    iVar2 = iVar6 + 1;
  } while (uVar3 == uVar8);
  uVar7 = (ulong)(level - (iVar6 + 1));
LAB_003f9688:
  if (uVar3 == uVar8) {
    NVar4.pip.value = (PointerIntPair<void_*,_6U,_6U,_unsigned_int>)0;
  }
  else {
    puVar5 = (ulong *)((ulong)(uVar3 + 1) * 8 + (long)pEVar1[uVar7].node);
    while( true ) {
      NVar4.pip.value = (PointerIntPair<void_*,_6U,_6U,_unsigned_int>)*puVar5;
      bVar10 = iVar6 == 0;
      iVar6 = iVar6 + -1;
      if (bVar10) break;
      puVar5 = (ulong *)((ulong)NVar4.pip.value & 0xffffffffffffffc0);
    }
  }
  return (NodeRef)NVar4.pip.value;
}

Assistant:

NodeRef Path::getRightSibling(uint32_t level) const {
    SLANG_ASSERT(level > 0);

    // Go up until we can go right.
    uint32_t l = level - 1;
    while (l && path[l].offset == path[l].size - 1)
        --l;

    // If we hit the root there is no right sibling.
    if (path[l].offset == path[l].size - 1)
        return NodeRef();

    // Start with right subtree and go down to the left
    // until we reach the original level.
    NodeRef node = path[l].childAt(path[l].offset + 1);
    for (++l; l != level; ++l)
        node = node.childAt(0);
    return node;
}